

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O1

void adios2::helper::HandshakeReader
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName)

{
  size_type *psVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  size_t sVar5;
  size_type *psVar6;
  size_type *psVar7;
  string engineLockFilename;
  json j;
  string engineFilename;
  vector<char,_std::allocator<char>_> address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  FileFStream ipstream;
  FileFStream lockstream;
  string local_728;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_708;
  string local_6f0 [3];
  string *local_678;
  string *local_670;
  FileFStream local_660;
  FileFStream local_348;
  
  psVar7 = &local_348.super_Transport.m_Type._M_string_length;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_708 = fullAddresses;
  local_348.super_Transport._vptr_Transport = (_func_int **)psVar7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_348);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_348,(ulong)(engineName->_M_dataplus)._M_p);
  psVar1 = &local_660.super_Transport.m_Type._M_string_length;
  local_660.super_Transport._vptr_Transport = (_func_int **)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if (local_660.super_Transport._vptr_Transport == (_func_int **)psVar6) {
    local_660.super_Transport.m_Type._M_string_length = *psVar6;
    local_660.super_Transport.m_Type.field_2._M_allocated_capacity = plVar4[3];
    local_660.super_Transport._vptr_Transport = (_func_int **)psVar1;
  }
  else {
    local_660.super_Transport.m_Type._M_string_length = *psVar6;
  }
  local_660.super_Transport.m_Type._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_660);
  local_728._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_728._M_dataplus._M_p == psVar6) {
    local_728.field_2._M_allocated_capacity = *psVar6;
    local_728.field_2._8_8_ = plVar4[3];
    local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  }
  else {
    local_728.field_2._M_allocated_capacity = *psVar6;
  }
  local_728._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_660.super_Transport._vptr_Transport != (_func_int **)psVar1) {
    operator_delete(local_660.super_Transport._vptr_Transport);
  }
  if (local_348.super_Transport._vptr_Transport != (_func_int **)psVar7) {
    operator_delete(local_348.super_Transport._vptr_Transport);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_660.super_Transport._vptr_Transport = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_660,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_660);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_660,(ulong)(engineName->_M_dataplus)._M_p);
  local_6f0[0]._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_6f0[0]._M_dataplus._M_p == psVar7) {
    local_6f0[0].field_2._0_8_ = *psVar7;
    local_6f0[0].field_2._8_8_ = plVar4[3];
    local_6f0[0]._M_dataplus._M_p = (pointer)&local_6f0[0].field_2;
  }
  else {
    local_6f0[0].field_2._0_8_ = *psVar7;
  }
  local_6f0[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_660.super_Transport._vptr_Transport != (_func_int **)psVar1) {
    operator_delete(local_660.super_Transport._vptr_Transport);
  }
  AvailableIpAddresses_abi_cxx11_();
  if (local_678 == local_670) {
    iVar3 = rand();
    sVar5 = (size_t)iVar3;
  }
  else {
    sVar5 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_660,local_678);
  }
  *appID = sVar5;
  Comm::BroadcastValue<unsigned_long>(comm,appID,0);
  transport::FileFStream::FileFStream(&local_660,comm);
  transport::FileFStream::Open(&local_660,local_6f0,Read,false,false);
  transport::FileFStream::FileFStream(&local_348,comm);
  do {
    transport::FileFStream::Open(&local_348,&local_728,Read,false,false);
    transport::FileFStream::Close(&local_348);
  } while( true );
}

Assistant:

void HandshakeReader(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName)
{
    const std::string engineLockFilename = name + "." + engineName + ".lock";
    const std::string engineFilename = name + "." + engineName;

    auto ips = helper::AvailableIpAddresses();
    if (ips.empty())
    {
        appID = rand();
    }
    else
    {
        std::hash<std::string> hash_fn;
        appID = hash_fn(ips[0]);
    }
    comm.BroadcastValue(appID);

    transport::FileFStream ipstream(comm);
    while (true)
    {
        try
        {
            ipstream.Open(engineFilename, Mode::Read);
            break;
        }
        catch (...)
        {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    transport::FileFStream lockstream(comm);
    while (true)
    {
        try
        {
            lockstream.Open(engineLockFilename, Mode::Read);
            lockstream.Close();
        }
        catch (...)
        {
            break;
        }
    }

    auto size = ipstream.GetSize();
    std::vector<char> address(size);
    ipstream.Read(address.data(), size);
    ipstream.Close();
    nlohmann::json j = nlohmann::json::parse(address);
    fullAddresses = j.get<std::vector<std::string>>();
}